

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O1

void __thiscall QPDFCryptoProvider::QPDFCryptoProvider(QPDFCryptoProvider *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  mapped_type *this_00;
  string default_crypto;
  key_type local_88;
  function<std::shared_ptr<QPDFCryptoImpl>_()> local_68;
  string local_48;
  
  std::__shared_ptr<QPDFCryptoProvider::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<QPDFCryptoProvider::Members>>
            ((__shared_ptr<QPDFCryptoProvider::Members,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<QPDFCryptoProvider::Members> *)&local_88);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"openssl","");
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_object =
       std::make_shared<QPDFCrypto_openssl>;
  local_68._M_invoker =
       std::
       _Function_handler<std::shared_ptr<QPDFCryptoImpl>_(),_std::shared_ptr<QPDFCrypto_openssl>_(*)()>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<QPDFCryptoImpl>_(),_std::shared_ptr<QPDFCrypto_openssl>_(*)()>
       ::_M_manager;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
            ::operator[](&((this->m).
                           super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->providers,&local_88);
  std::function<std::shared_ptr<QPDFCryptoImpl>_()>::operator=(this_00,&local_68);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"QPDF_CRYPTO_PROVIDER","");
  bVar2 = QUtil::get_env(&local_48,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)local_88._M_string_length,0x264d6b);
  }
  setDefaultProvider_internal(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

QPDFCryptoProvider::QPDFCryptoProvider() :
    m(std::make_shared<Members>())
{
#ifdef USE_CRYPTO_NATIVE
    registerImpl_internal("native", std::make_shared<QPDFCrypto_native>);
#endif
#ifdef USE_CRYPTO_GNUTLS
    registerImpl_internal("gnutls", std::make_shared<QPDFCrypto_gnutls>);
#endif
#ifdef USE_CRYPTO_OPENSSL
    registerImpl_internal("openssl", std::make_shared<QPDFCrypto_openssl>);
#endif
    std::string default_crypto;
    if (!QUtil::get_env("QPDF_CRYPTO_PROVIDER", &default_crypto)) {
        default_crypto = DEFAULT_CRYPTO;
    }
    setDefaultProvider_internal(default_crypto);
}